

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O2

string * __thiscall
MADPComponentDiscreteObservations::SoftPrintJointObservationSet_abi_cxx11_
          (string *__return_storage_ptr__,MADPComponentDiscreteObservations *this)

{
  pointer ppJVar1;
  ostream *poVar2;
  E *this_00;
  pointer ppJVar3;
  stringstream ss_1;
  ostream local_328 [376];
  stringstream ss;
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  if (this->_m_initialized != false) {
    ppJVar1 = (this->_m_jointObservationVec).
              super__Vector_base<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppJVar3 = (this->_m_jointObservationVec).
                   super__Vector_base<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppJVar3 != ppJVar1;
        ppJVar3 = ppJVar3 + 1) {
      (*((*ppJVar3)->super_JointObservation)._vptr_JointObservation[3])(&ss_1);
      poVar2 = std::operator<<(local_1a0,(string *)&ss_1);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&ss_1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss_1);
  poVar2 = std::operator<<(local_328,"MADPComponentDiscreteObservations::PrintJointObservationSet(")
  ;
  poVar2 = std::operator<<(poVar2,") - Error: not initialized. ");
  std::endl<char,std::char_traits<char>>(poVar2);
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,&ss_1);
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

string MADPComponentDiscreteObservations::SoftPrintJointObservationSet() const
{
    stringstream ss;
    if(!_m_initialized)
    {
    stringstream ss;
        ss << "MADPComponentDiscreteObservations::PrintJointObservationSet("<<
       ") - Error: not initialized. "<<endl;
    throw E(ss);
    }
    vector<JointObservationDiscrete*>::const_iterator jo_it = 
    _m_jointObservationVec.begin();
    vector<JointObservationDiscrete*>::const_iterator jo_last = 
    _m_jointObservationVec.end();
    while(jo_it != jo_last)
    {
        ss << (*jo_it)->SoftPrint()<<endl;
        jo_it++;    
    }
    return(ss.str());
}